

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

vector<Card,_std::allocator<Card>_> * __thiscall
Node::get_untried_moves
          (vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Node *this,
          vector<Card,_std::allocator<Card>_> *legalMoves)

{
  bool bVar1;
  reference ppNVar2;
  player_move *__t;
  __tuple_element_t<1UL,_tuple<int,_Card>_> *p_Var3;
  iterator iVar4;
  iterator iVar5;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<Card,_std::allocator<Card>_>_> __result;
  __tuple_element_t<1UL,_tuple<int,_Card>_> local_68;
  Card triedCard;
  player_move *tried_move;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_40;
  iterator childIterator;
  vector<Card,_std::allocator<Card>_> tried_cards;
  vector<Card,_std::allocator<Card>_> *legalMoves_local;
  Node *this_local;
  vector<Card,_std::allocator<Card>_> *untried_moves;
  
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&childIterator);
  local_40._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->m_children);
  while( true ) {
    tried_move = (player_move *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->m_children)
    ;
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       &tried_move);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_40);
    __t = get_move(*ppNVar2);
    p_Var3 = std::get<1ul,int,Card>(__t);
    local_68 = *p_Var3;
    std::vector<Card,_std::allocator<Card>_>::push_back
              ((vector<Card,_std::allocator<Card>_> *)&childIterator,&local_68);
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&local_40);
  }
  iVar4 = std::vector<Card,_std::allocator<Card>_>::begin(legalMoves);
  iVar5 = std::vector<Card,_std::allocator<Card>_>::end(legalMoves);
  std::sort<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>>
            ((__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)iVar4._M_current,
             (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)iVar5._M_current)
  ;
  iVar4 = std::vector<Card,_std::allocator<Card>_>::begin
                    ((vector<Card,_std::allocator<Card>_> *)&childIterator);
  iVar5 = std::vector<Card,_std::allocator<Card>_>::end
                    ((vector<Card,_std::allocator<Card>_> *)&childIterator);
  std::sort<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>>
            ((__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)iVar4._M_current,
             (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)iVar5._M_current)
  ;
  std::vector<Card,_std::allocator<Card>_>::vector(__return_storage_ptr__);
  iVar4 = std::vector<Card,_std::allocator<Card>_>::begin(legalMoves);
  iVar5 = std::vector<Card,_std::allocator<Card>_>::end(legalMoves);
  __first2 = std::vector<Card,_std::allocator<Card>_>::begin
                       ((vector<Card,_std::allocator<Card>_> *)&childIterator);
  __last2 = std::vector<Card,_std::allocator<Card>_>::end
                      ((vector<Card,_std::allocator<Card>_> *)&childIterator);
  __result = std::back_inserter<std::vector<Card,std::allocator<Card>>>(__return_storage_ptr__);
  std::
  set_difference<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,std::back_insert_iterator<std::vector<Card,std::allocator<Card>>>>
            ((__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)iVar4._M_current,
             (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)iVar5._M_current,
             (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)
             __first2._M_current,
             (__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>)
             __last2._M_current,__result);
  std::vector<Card,_std::allocator<Card>_>::~vector
            ((vector<Card,_std::allocator<Card>_> *)&childIterator);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> Node::get_untried_moves(std::vector<Card> legalMoves)
{
    std::vector<Card> tried_cards;
    for (std::vector<Node*>::iterator childIterator = m_children.begin();
         childIterator != m_children.end(); ++childIterator)
    {
        player_move* tried_move = (*childIterator)->get_move();
        Card triedCard = std::get<1>(*tried_move);
        tried_cards.push_back(triedCard);
    }

    std::sort(legalMoves.begin(), legalMoves.end());
    std::sort(tried_cards.begin(), tried_cards.end());

    std::vector<Card> untried_moves;
    std::set_difference (legalMoves.begin(), legalMoves.end(), tried_cards.begin(), tried_cards.end(), back_inserter(untried_moves));

    return untried_moves;
}